

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CEditor::RenderGrid(CEditor *this,CLayerGroup *pGroup)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  CUIRect *pCVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  float aGroupPoints [4];
  int local_70;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_GridActive == true) {
    CLayerGroup::Mapping(pGroup,&local_48);
    pCVar4 = CUI::Screen(&this->m_UI);
    fVar1 = pCVar4->w;
    pCVar4 = CUI::Screen(&this->m_UI);
    uVar3 = this->m_ZoomLevel;
    local_70 = 0x10;
    if ((((100 < (int)uVar3) && (local_70 = 0x20, 0xfa < uVar3)) && (local_70 = 0x40, 0x1c2 < uVar3)
        ) && (local_70 = 0x80, 0x352 < uVar3)) {
      local_70 = (uint)(0x60e < uVar3) * 0x100 + 0x100;
    }
    iVar6 = (int)(local_48 / (float)local_70);
    iVar8 = (int)(local_44 / (float)local_70);
    fVar2 = pCVar4->h;
    uVar9 = (long)iVar6 % (long)this->m_GridFactor & 0xffffffff;
    uVar7 = (long)iVar8 % (long)this->m_GridFactor & 0xffffffff;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])(this->m_pGraphics,0xffffffff);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])();
    iVar5 = (int)fVar1;
    if (0 < iVar5) {
      iVar6 = iVar6 * local_70;
      fVar10 = (float)iVar6;
      iVar8 = iVar8 * local_70;
      fVar11 = (float)iVar8;
      do {
        uVar3 = *(uint *)(this->m_pConfig->m_ClVersionServer +
                         (ulong)((int)uVar7 % this->m_GridFactor == 0) * 4 + -0x38);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  ((float)(uVar3 >> 0x18) / 255.0,(float)(uVar3 >> 0x10 & 0xff) / 255.0,
                   (float)(uVar3 >> 8 & 0xff) / 255.0,(float)(uVar3 & 0xff) / 255.0);
        local_54 = (float)iVar8;
        local_50 = local_40 + fVar1;
        local_58 = fVar10;
        local_4c = local_54;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])
                  (this->m_pGraphics,&local_58,1);
        uVar3 = *(uint *)(this->m_pConfig->m_ClVersionServer +
                         (ulong)((int)uVar9 % this->m_GridFactor == 0) * 4 + -0x38);
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                  ((float)(uVar3 >> 0x18) / 255.0,(float)(uVar3 >> 0x10 & 0xff) / 255.0,
                   (float)(uVar3 >> 8 & 0xff) / 255.0,(float)(uVar3 & 0xff) / 255.0);
        local_58 = (float)iVar6;
        local_4c = local_3c + fVar2;
        local_54 = fVar11;
        local_50 = local_58;
        (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])
                  (this->m_pGraphics,&local_58,1);
        uVar9 = (ulong)((int)uVar9 + 1);
        iVar6 = iVar6 + local_70;
        iVar8 = iVar8 + local_70;
        uVar7 = (ulong)((int)uVar7 + 1);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::RenderGrid(CLayerGroup *pGroup)
{
	if(!m_GridActive)
		return;

	vec4 GridColor;
	float aGroupPoints[4];
	pGroup->Mapping(aGroupPoints);

	float w = UI()->Screen()->w;
	float h = UI()->Screen()->h;

	int LineDistance = GetLineDistance();

	int XOffset = aGroupPoints[0]/LineDistance;
	int YOffset = aGroupPoints[1]/LineDistance;
	int XGridOffset = XOffset % m_GridFactor;
	int YGridOffset = YOffset % m_GridFactor;

	Graphics()->TextureClear();
	Graphics()->LinesBegin();

	for(int i = 0; i < (int)w; i++)
	{
		if((i+YGridOffset) % m_GridFactor == 0)
			GridColor = HexToRgba(Config()->m_EdColorGridOuter);
		else
			GridColor = HexToRgba(Config()->m_EdColorGridInner);

		Graphics()->SetColor(GridColor.r, GridColor.g, GridColor.b, GridColor.a);
		IGraphics::CLineItem Line = IGraphics::CLineItem(LineDistance*XOffset, LineDistance*i+LineDistance*YOffset, w+aGroupPoints[2], LineDistance*i+LineDistance*YOffset);
		Graphics()->LinesDraw(&Line, 1);

		if((i+XGridOffset) % m_GridFactor == 0)
			GridColor = HexToRgba(Config()->m_EdColorGridOuter);
		else
			GridColor = HexToRgba(Config()->m_EdColorGridInner);

		Graphics()->SetColor(GridColor.r, GridColor.g, GridColor.b, GridColor.a);
		Line = IGraphics::CLineItem(LineDistance*i+LineDistance*XOffset, LineDistance*YOffset, LineDistance*i+LineDistance*XOffset, h+aGroupPoints[3]);
		Graphics()->LinesDraw(&Line, 1);
	}
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	Graphics()->LinesEnd();
}